

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPTCPTransmitter::PollSocket(RTPTCPTransmitter *this,SocketType sock,SocketData *sdata)

{
  size_t *psVar1;
  int iVar2;
  RTPMemoryManager *pRVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  bool bVar9;
  size_t len;
  bool complete;
  timespec tpMono_1;
  int local_a0;
  long local_98;
  timespec local_90;
  _List_node_base *local_80;
  _List_node_base *local_78;
  _List_node_base *local_70;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *local_68;
  int *local_60;
  RTPTCPTransmitter *local_58;
  SocketData *local_50;
  _List_node_base *local_48;
  timespec local_40;
  
  local_60 = &sdata->m_lengthBufferOffset;
  local_68 = &this->m_rawpacketlist;
  local_70 = (_List_node_base *)&PTR_CreateCopy_0013fcf0;
  local_58 = this;
  local_50 = sdata;
  do {
    local_98 = 0;
    ioctl(sock,0x541b,&local_98);
    lVar5 = local_98;
    if (local_98 != 0) {
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&local_90);
        clock_gettime(1,&local_40);
        local_78 = (_List_node_base *)
                   ((double)local_90.tv_nsec * 1e-09 +
                   (double)CONCAT71(local_90.tv_sec._1_7_,(char)local_90.tv_sec));
        RTPTime::CurrentTime()::s_startOffet =
             (double)local_78 - ((double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec);
      }
      else {
        clock_gettime(1,&local_90);
        local_78 = (_List_node_base *)
                   ((double)local_90.tv_nsec * 1e-09 +
                    (double)CONCAT71(local_90.tv_sec._1_7_,(char)local_90.tv_sec) +
                   RTPTime::CurrentTime()::s_startOffet);
      }
      iVar4 = (int)local_98;
      if (0x10000 < (int)local_98) {
        iVar4 = 0x10001;
      }
      local_90.tv_sec._0_1_ = '\0';
      iVar6 = SocketData::ProcessAvailableBytes
                        (sdata,sock,iVar4,(bool *)&local_90,
                         (this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
      iVar4 = iVar6;
      if ((-1 < iVar6) && (iVar4 = local_a0, (char)local_90.tv_sec == '\x01')) {
        p_Var7 = (_List_node_base *)sdata->m_pDataBuffer;
        sdata->m_pDataBuffer = (uint8_t *)0x0;
        if (p_Var7 != (_List_node_base *)0x0) {
          iVar2 = sdata->m_dataLength;
          local_60[0] = 0;
          local_60[1] = 0;
          *(undefined8 *)(local_60 + 2) = 0;
          local_60[4] = 0;
          pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          local_80 = p_Var7;
          if (pRVar3 == (RTPMemoryManager *)0x0) {
            p_Var7 = (_List_node_base *)operator_new(0x10);
          }
          else {
            p_Var7 = (_List_node_base *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,0x10,0x17);
          }
          *(undefined4 *)&p_Var7->_M_prev = 4;
          p_Var7->_M_next = local_70;
          *(SocketType *)((long)&p_Var7->_M_prev + 4) = sock;
          bVar9 = true;
          if (4 < iVar2) {
            bVar9 = (byte)(*(char *)((long)&local_80->_M_next + 1) + 0x33U) < 0xfb;
          }
          pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          local_48 = (_List_node_base *)(long)iVar2;
          if (pRVar3 == (RTPMemoryManager *)0x0) {
            p_Var8 = (_List_node_base *)operator_new(0x38);
          }
          else {
            p_Var8 = (_List_node_base *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,0x38,0x1b);
          }
          this = local_58;
          p_Var8->_M_prev =
               (_List_node_base *)(local_58->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          p_Var8->_M_next = (_List_node_base *)&PTR__RTPRawPacket_0013eef0;
          p_Var8[2]._M_next = local_78;
          p_Var8[1]._M_next = local_80;
          p_Var8[1]._M_prev = local_48;
          p_Var8[2]._M_prev = p_Var7;
          *(bool *)&p_Var8[3]._M_next = bVar9;
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = p_Var8;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(this->m_rawpacketlist).
                    super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          sdata = local_50;
        }
      }
      local_a0 = iVar4;
      if (iVar6 < 0) {
        return local_a0;
      }
    }
    if (lVar5 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int RTPTCPTransmitter::PollSocket(SocketType sock, SocketData &sdata)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	unsigned long len;
#else 
	size_t len;
#endif // RTP_SOCKETTYPE_WINSOCK
	bool dataavailable;
	
	do
	{
		len = 0;
		RTPIOCTL(sock, FIONREAD, &len);

		if (len <= 0) 
			dataavailable = false;
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			int relevantLen = RTPTCPTRANS_MAXPACKSIZE+2;
			
			if ((int)len < relevantLen)
				relevantLen = (int)len;

			bool complete = false;
			int status = sdata.ProcessAvailableBytes(sock, relevantLen, complete, GetMemoryManager());
			if (status < 0)
				return status;
			
			if (complete)
			{
				uint8_t *pBuf = sdata.ExtractDataBuffer();
				if (pBuf)
				{
					int dataLength = sdata.m_dataLength;
					sdata.Reset();

					RTPTCPAddress *pAddr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(sock);
					if (pAddr == 0)
						return ERR_RTP_OUTOFMEM;

					bool isrtp = true;
					if (dataLength > (int)sizeof(RTCPCommonHeader))
					{
						RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)pBuf;
						uint8_t packettype = rtcpheader->packettype;

						if (packettype >= 200 && packettype <= 204)
							isrtp = false;
					}
						
					RTPRawPacket *pPack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(pBuf, dataLength, pAddr, curtime, isrtp, GetMemoryManager());
					if (pPack == 0)
					{
						RTPDelete(pAddr,GetMemoryManager());
						RTPDeleteByteArray(pBuf,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					m_rawpacketlist.push_back(pPack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}